

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_mask_sse4.h
# Opt level: O2

void blend_a64_d16_mask_w8_sse41
               (uint8_t *dst,CONV_BUF_TYPE *src0,CONV_BUF_TYPE *src1,__m128i *m,
               __m128i *v_round_offset,__m128i *v_maxval,int shift)

{
  __m128i alVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  alVar1 = *m;
  auVar2 = vpsubw_avx((undefined1  [16])*v_maxval,(undefined1  [16])alVar1);
  auVar4 = vpunpcklwd_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
  auVar5 = vpunpcklwd_avx((undefined1  [16])alVar1,auVar2);
  auVar4 = vpmaddwd_avx(auVar4,auVar5);
  auVar5 = vpunpckhwd_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
  auVar3 = vpunpckhwd_avx((undefined1  [16])alVar1,auVar2);
  auVar4 = vpsubd_avx(auVar4,(undefined1  [16])*v_round_offset);
  auVar2 = vpsrad_avx(auVar4,ZEXT416((uint)shift));
  auVar4 = vpmaddwd_avx(auVar5,auVar3);
  auVar4 = vpsubd_avx(auVar4,(undefined1  [16])*v_round_offset);
  auVar4 = vpsrad_avx(auVar4,ZEXT416((uint)shift));
  auVar4 = vpackssdw_avx(auVar2,auVar4);
  auVar4 = vpackuswb_avx(auVar4,auVar4);
  *(long *)dst = auVar4._0_8_;
  return;
}

Assistant:

static inline void blend_a64_d16_mask_w8_sse41(
    uint8_t *dst, const CONV_BUF_TYPE *src0, const CONV_BUF_TYPE *src1,
    const __m128i *m, const __m128i *v_round_offset, const __m128i *v_maxval,
    int shift) {
  const __m128i max_minus_m = _mm_sub_epi16(*v_maxval, *m);
  const __m128i s0 = xx_loadu_128(src0);
  const __m128i s1 = xx_loadu_128(src1);
  __m128i res_lo = _mm_madd_epi16(_mm_unpacklo_epi16(s0, s1),
                                  _mm_unpacklo_epi16(*m, max_minus_m));
  __m128i res_hi = _mm_madd_epi16(_mm_unpackhi_epi16(s0, s1),
                                  _mm_unpackhi_epi16(*m, max_minus_m));
  res_lo = _mm_srai_epi32(_mm_sub_epi32(res_lo, *v_round_offset), shift);
  res_hi = _mm_srai_epi32(_mm_sub_epi32(res_hi, *v_round_offset), shift);
  const __m128i res_e = _mm_packs_epi32(res_lo, res_hi);
  const __m128i res = _mm_packus_epi16(res_e, res_e);

  _mm_storel_epi64((__m128i *)(dst), res);
}